

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureBarrierTests.cpp
# Opt level: O0

void __thiscall
gl4cts::TextureBarrierSameTexelRWBase::updateTextureData(TextureBarrierSameTexelRWBase *this)

{
  GLuint *pGVar1;
  uint local_1c;
  uint local_18;
  GLuint i;
  GLuint y;
  GLuint x;
  TextureBarrierSameTexelRWBase *this_local;
  
  for (i = 0; i < (this->super_TextureBarrierBasicOutline).m_width; i = i + 1) {
    for (local_18 = 0; local_18 < (this->super_TextureBarrierBasicOutline).m_height;
        local_18 = local_18 + 1) {
      for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
        pGVar1 = TextureBarrierBasicOutline::texel
                           (&this->super_TextureBarrierBasicOutline,
                            (this->super_TextureBarrierBasicOutline).m_reference[local_1c],i,
                            local_18);
        *pGVar1 = *pGVar1 + 1;
      }
    }
  }
  return;
}

Assistant:

virtual void updateTextureData()
	{
		for (GLuint x = 0; x < m_width; ++x)
			for (GLuint y = 0; y < m_height; ++y)
			{
				for (GLuint i = 0; i < NUM_TEXTURES; ++i)
				{
					texel(m_reference[i], x, y)++;
				}
			}
	}